

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O1

uc_err uc_reg_read_batch2(uc_engine *uc,int *regs,void **vals,size_t *sizes,int count)

{
  uc_mode uVar1;
  reg_read_t p_Var2;
  void *pvVar3;
  uc_err uVar4;
  ulong uVar5;
  
  if ((uc->init_done != false) || (uVar4 = uc_init_engine(uc), uVar4 == UC_ERR_OK)) {
    if (0 < count) {
      p_Var2 = uc->reg_read;
      pvVar3 = uc->cpu->env_ptr;
      uVar1 = uc->mode;
      uVar5 = 0;
      do {
        uVar4 = (*p_Var2)(pvVar3,uVar1,regs[uVar5],vals[uVar5],sizes);
        if (uVar4 != UC_ERR_OK) {
          return uVar4;
        }
        uVar5 = uVar5 + 1;
        sizes = sizes + 1;
      } while ((uint)count != uVar5);
    }
    uVar4 = UC_ERR_OK;
  }
  return uVar4;
}

Assistant:

UNICORN_EXPORT
uc_err uc_reg_read_batch2(uc_engine *uc, int *regs, void *const *vals,
                          size_t *sizes, int count)
{
    UC_INIT(uc);
    reg_read_t reg_read = uc->reg_read;
    void *env = uc->cpu->env_ptr;
    int mode = uc->mode;
    int i;

    for (i = 0; i < count; i++) {
        unsigned int regid = regs[i];
        void *value = vals[i];
        uc_err err = reg_read(env, mode, regid, value, sizes + i);
        if (err) {
            return err;
        }
    }

    return UC_ERR_OK;
}